

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_parse_finished(mbedtls_ssl_context *ssl)

{
  int iVar1;
  ulong uVar2;
  mbedtls_ssl_config *pmVar3;
  uchar buf [12];
  
  (*ssl->handshake->calc_finished)(ssl,buf,~*(uint *)&ssl->conf->field_0x174 & 1);
  iVar1 = mbedtls_ssl_read_record(ssl);
  if (iVar1 == 0) {
    if (ssl->in_msgtype == 0x16) {
      if (((*ssl->in_msg == '\x14') &&
          (uVar2 = (ulong)((ssl->conf->field_0x174 & 2) >> 1) * 8, ssl->in_hslen == uVar2 + 0x10))
         && (iVar1 = mbedtls_ssl_safer_memcmp(ssl->in_msg + (uVar2 | 4),buf,0xc), iVar1 == 0)) {
        ssl->verify_data_len = 0xc;
        *(undefined4 *)(ssl->peer_verify_data + 8) = buf._8_4_;
        *(undefined8 *)ssl->peer_verify_data = buf._0_8_;
        if (ssl->handshake->resume == 0) {
          ssl->state = ssl->state + 1;
          pmVar3 = ssl->conf;
        }
        else {
          pmVar3 = ssl->conf;
          if (((pmVar3->field_0x174 & 1) != 0) || (ssl->state = 10, (pmVar3->field_0x174 & 1) != 0))
          {
            ssl->state = 0xf;
          }
        }
        if ((pmVar3->field_0x174 & 2) == 0) {
          return 0;
        }
        mbedtls_ssl_recv_flight_completed(ssl);
        return 0;
      }
      mbedtls_ssl_send_alert_message(ssl,'\x02','2');
      iVar1 = -0x7e80;
    }
    else {
      mbedtls_ssl_send_alert_message(ssl,'\x02','\n');
      iVar1 = -0x7700;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ssl_parse_finished( mbedtls_ssl_context *ssl )
{
    int ret;
    unsigned int hash_len;
    unsigned char buf[SSL_MAX_HASH_LEN];

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> parse finished" ) );

    ssl->handshake->calc_finished( ssl, buf, ssl->conf->endpoint ^ 1 );

    if( ( ret = mbedtls_ssl_read_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_read_record", ret );
        return( ret );
    }

    if( ssl->in_msgtype != MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_UNEXPECTED_MESSAGE );
        return( MBEDTLS_ERR_SSL_UNEXPECTED_MESSAGE );
    }

    /* There is currently no ciphersuite using another length with TLS 1.2 */
#if defined(MBEDTLS_SSL_PROTO_SSL3)
    if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
        hash_len = 36;
    else
#endif
        hash_len = 12;

    if( ssl->in_msg[0] != MBEDTLS_SSL_HS_FINISHED ||
        ssl->in_hslen  != mbedtls_ssl_hs_hdr_len( ssl ) + hash_len )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_FINISHED );
    }

    if( mbedtls_ssl_safer_memcmp( ssl->in_msg + mbedtls_ssl_hs_hdr_len( ssl ),
                      buf, hash_len ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad finished message" ) );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_DECODE_ERROR );
        return( MBEDTLS_ERR_SSL_BAD_HS_FINISHED );
    }

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    ssl->verify_data_len = hash_len;
    memcpy( ssl->peer_verify_data, buf, hash_len );
#endif

    if( ssl->handshake->resume != 0 )
    {
#if defined(MBEDTLS_SSL_CLI_C)
        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
            ssl->state = MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC;
#endif
#if defined(MBEDTLS_SSL_SRV_C)
        if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
#endif
    }
    else
        ssl->state++;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        mbedtls_ssl_recv_flight_completed( ssl );
#endif

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= parse finished" ) );

    return( 0 );
}